

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O2

error_info * __thiscall
toml::detail::make_error_info_rec<toml::source_location,char_const(&)[21]>
          (error_info *__return_storage_ptr__,detail *this,error_info *e,source_location *loc,
          string *msg,source_location *tail,char (*tail_1) [21])

{
  allocator<char> local_1c1;
  source_location *local_1c0;
  string local_1b8;
  error_info local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  source_location local_120;
  source_location local_a8;
  
  local_1c0 = tail;
  source_location::source_location(&local_a8,(source_location *)e);
  std::__cxx11::string::string
            (&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc);
  error_info::add_locations((error_info *)this,&local_a8,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  source_location::~source_location(&local_a8);
  error_info::error_info(&local_198,(error_info *)this);
  source_location::source_location(&local_120,(source_location *)msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,&local_1c0->is_ok_,&local_1c1);
  make_error_info_rec<>(__return_storage_ptr__,&local_198,&local_120,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  source_location::~source_location(&local_120);
  error_info::~error_info(&local_198);
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info_rec(error_info e,
        source_location loc, std::string msg, Ts&& ... tail)
{
    e.add_locations(std::move(loc), std::move(msg));
    return make_error_info_rec(std::move(e), std::forward<Ts>(tail)...);
}